

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hpp
# Opt level: O0

void __thiscall
nestl::test::allocator_with_state<nestl::impl::detail::rb_tree_node<int>_>::deallocate
          (allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *this,rb_tree_node<int> *p,
          size_t param_2)

{
  bool bVar1;
  element_type *peVar2;
  rb_tree_node<int> *local_50;
  iterator local_48;
  rb_tree_const_iterator<void_*> local_40;
  rb_tree_node<int> *local_38;
  iterator local_30;
  const_iterator local_28;
  const_iterator pos;
  size_t param_2_local;
  rb_tree_node<int> *p_local;
  allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *this_local;
  
  pos.m_node = (base_ptr)param_2;
  peVar2 = impl::shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
           ::operator->(&this->m_allocated_storage);
  local_38 = p;
  local_30.m_node =
       (base_ptr)
       impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>::find(peVar2,&local_38);
  impl::detail::rb_tree_const_iterator<void_*>::rb_tree_const_iterator(&local_28,&local_30);
  peVar2 = impl::shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
           ::operator->(&this->m_allocated_storage);
  local_48.m_node =
       (base_ptr)impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>::end(peVar2);
  impl::detail::rb_tree_const_iterator<void_*>::rb_tree_const_iterator(&local_40,&local_48);
  bVar1 = impl::detail::rb_tree_const_iterator<void_*>::operator==(&local_28,&local_40);
  if (bVar1) {
    if (p != (rb_tree_node<int> *)0x0) {
      local_50 = p;
      fatal_failure<char_const(&)[10],void*,char_const(&)[36]>
                ((char (*) [10])"pointer [",&local_50,
                 (char (*) [36])"] does not belong to this allocator");
    }
  }
  else {
    peVar2 = impl::
             shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
             operator->(&this->m_allocated_storage);
    impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>::erase(peVar2,local_28);
    operator_delete(p);
  }
  return;
}

Assistant:

void deallocate(T* p, std::size_t /* n */) NESTL_NOEXCEPT_SPEC
    {
        nestl::set<void*>::const_iterator pos = m_allocated_storage->find(p);
        if (pos == m_allocated_storage->end())
        {
            if (p)
            {
                fatal_failure("pointer [", static_cast<void*>(p), "] does not belong to this allocator");

                /**
                 * @note possible memory leak here, because we do not know how to deallocate
                 */
            }
        }
        else
        {
            m_allocated_storage->erase(pos);
            ::operator delete(p);
        }
    }